

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringConversion.hxx
# Opt level: O3

string * __thiscall
FileParse::enumToString<BSDFData::ScatteringDataType,4ul>
          (string *__return_storage_ptr__,FileParse *this,ScatteringDataType value,
          array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4UL>
          *values)

{
  long lVar1;
  long lVar2;
  undefined4 in_register_00000014;
  
  if ((uint)this < 4) {
    lVar2 = ((ulong)this & 0xffffffff) * 0x20;
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    lVar1 = *(long *)(CONCAT44(in_register_00000014,value) + lVar2);
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,lVar1,
               *(long *)(CONCAT44(in_register_00000014,value) + 8 + lVar2) + lVar1);
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"Unknown","");
  }
  return __return_storage_ptr__;
}

Assistant:

std::string enumToString(EnumType value, const std::array<std::string, N> & values)
    {
        const auto index{static_cast<std::size_t>(value)};
        if(index < values.size())
        {
            return values[index];
        }
        return "Unknown";
    }